

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_insn_t_conflict
MIR_new_insn_arr(MIR_context_t ctx,MIR_insn_code_t code,size_t nops,MIR_op_t *ops)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  code *pcVar3;
  MIR_error_func_t p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  MIR_error_type_t MVar12;
  size_t sVar13;
  MIR_insn_t_conflict pMVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  size_t unaff_RBX;
  undefined8 *puVar19;
  MIR_context_t *ppMVar20;
  undefined8 *puVar21;
  MIR_context_t *ppMVar22;
  char *pcVar23;
  MIR_context_t unaff_R12;
  MIR_context_t pMVar24;
  MIR_proto_t unaff_R13;
  bool bVar25;
  undefined8 uStack_b0;
  MIR_context_t local_a8;
  ulong local_a0;
  ulong local_98;
  MIR_var_t local_90;
  MIR_var_t local_78;
  MIR_var_t local_60;
  MIR_var_t local_48;
  
  ppMVar22 = &local_a8;
  ppMVar20 = &local_a8;
  uStack_b0 = 0x1123f9;
  local_a8 = ctx;
  sVar13 = insn_code_nops(ctx,code);
  pMVar24 = local_a8;
  if (ops == (MIR_op_t *)0x0 && nops != 0) {
    uStack_b0 = 0x11275f;
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  local_a0 = (ulong)code;
  if (code - MIR_SWITCH < 0xfffffffd) {
    if (code != MIR_SWITCH) {
      if (((code == MIR_RET) || (code == MIR_UNSPEC)) || (code == MIR_USE)) goto LAB_0011247c;
      if (code == MIR_PHI) goto LAB_00112510;
      if (sVar13 == nops) goto LAB_00112452;
      pcVar23 = "wrong number of operands for insn %s";
      pcVar18 = insn_descs[code].name;
      MVar12 = MIR_ops_num_error;
LAB_001127a1:
      uStack_b0 = 0x1127ab;
      (*local_a8->error_func)(MVar12,pcVar23,pcVar18);
LAB_001127ab:
      p_Var4 = local_a8->error_func;
      uStack_b0 = 0x1127c7;
      VARR_MIR_var_tget(&local_48,unaff_R13->args,unaff_RBX);
      pcVar23 = "call";
      if ((int)local_a0 == 0xb5) {
        pcVar23 = "unspec";
      }
      uStack_b0 = 0x1127f8;
      (*p_Var4)(MIR_wrong_type_error,
                "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                local_48.size,unaff_R12->gen_ctx,pcVar23);
LAB_001127f8:
      pcVar23 = "call";
      if ((int)local_a0 == 0xb5) {
        pcVar23 = "unspec";
      }
      uStack_b0 = 0x112830;
      (*local_a8->error_func)
                ((int)local_a0 == 0xb5 | MIR_call_op_error,
                 "number of %s operands or results does not correspond to prototype %s",pcVar23,
                 unaff_R13->name);
      goto LAB_00112830;
    }
  }
  else {
LAB_00112452:
    if (code == MIR_PHI) {
LAB_00112510:
      if (2 < nops) goto LAB_0011251a;
LAB_00112830:
      pcVar23 = "number of MIR_PHI operands is less 3";
      goto LAB_00112840;
    }
    if (code != MIR_SWITCH) {
LAB_0011247c:
      if (2 < code - MIR_CALL) {
        if (code == MIR_VA_ARG) {
          if (ops[2].field_0x8 != '\n') {
            pcVar23 = "3rd operand of va_arg should be any memory with given type";
            pMVar24 = unaff_R12;
            goto LAB_0011286f;
          }
          goto LAB_0011251a;
        }
        if (code == MIR_PRSET) {
          if (ops[1].field_0x8 != '\x03') goto LAB_00112868;
          goto LAB_0011251a;
        }
        if (code != MIR_UNSPEC) {
          if (code - MIR_PRBEQ < 2) {
            ppMVar20 = &local_a8;
            if (ops[2].field_0x8 != '\x03') goto LAB_00112868;
            if ((ops[1].field_0x8 != '\x01') && (ops[1].field_0x8 != '\n')) {
              pcVar23 = "2nd operand of property branch should be any memory or reg with given type"
              ;
              ppMVar22 = &local_a8;
              pMVar24 = unaff_R12;
              goto LAB_0011286f;
            }
          }
          goto LAB_0011251a;
        }
      }
      local_98 = (ulong)(code != MIR_UNSPEC) + 1;
      if (nops < local_98) {
        pcVar23 = "wrong number of call/unspec operands";
        goto LAB_00112840;
      }
      if (code == MIR_UNSPEC) {
        ppMVar20 = &local_a8;
        if (ops->field_0x8 != '\x03') goto LAB_0011284c;
        uVar15 = (ops->u).u;
        uStack_b0 = 0x1124f4;
        sVar13 = VARR_MIR_proto_tlength(local_a8->unspec_protos);
        ppMVar20 = &local_a8;
        if (sVar13 <= uVar15) goto LAB_0011284c;
        uStack_b0 = 0x11250b;
        unaff_R13 = VARR_MIR_proto_tget(pMVar24->unspec_protos,(ops->u).str.len);
      }
      else {
        if ((ops->field_0x8 != '\b') || (*(int *)&((ops->u).label)->ops[0].data != 1)) {
          pcVar23 = "the 1st call operand should be a prototype";
          puVar21 = &uStack_b0;
          uStack_b0 = 0x16;
          unaff_R12 = local_a8;
          goto LAB_00112860;
        }
        unaff_R13 = *(MIR_proto_t *)((long)&((ops->u).label)->ops[0].u + 0x10);
      }
      uVar15 = (ulong)unaff_R13->nres;
      if (unaff_R13->args != (VARR_MIR_var_t *)0x0) {
        uVar15 = uVar15 + unaff_R13->args->els_num;
      }
      unaff_R12 = pMVar24;
      if ((uVar15 + local_98 <= nops) &&
         ((uVar15 + local_98 == nops || (unaff_R13->vararg_p != '\0')))) {
        unaff_R12 = (MIR_context_t)((long)&ops[local_98].u + 0x18);
        for (uVar15 = 0; local_98 + uVar15 < nops; uVar15 = uVar15 + 1) {
          if (*(char *)&unaff_R12[-1].hard_reg_ctx == '\n') {
            uVar16 = (ulong)unaff_R13->nres;
            if (*(byte *)&unaff_R12[-1].interp_ctx - 0x12 < 0xfffffffa) goto LAB_0011264c;
            unaff_RBX = uVar15 - uVar16;
            if (uVar15 < uVar16) {
              bVar25 = (int)local_a0 == 0xb5;
              pcVar23 = "result of %s is block type memory";
LAB_0011279b:
              pcVar18 = "call";
              if (bVar25) {
                pcVar18 = "unspec";
              }
              MVar12 = MIR_wrong_type_error;
              goto LAB_001127a1;
            }
            uStack_b0 = 0x1125fd;
            sVar13 = VARR_MIR_var_tlength(unaff_R13->args);
            if (unaff_RBX < sVar13) {
              uStack_b0 = 0x112617;
              VARR_MIR_var_tget(&local_60,unaff_R13->args,unaff_RBX);
              if (local_60.type != *(byte *)&unaff_R12[-1].interp_ctx) {
                bVar25 = (int)local_a0 == 0xb5;
                pcVar23 = "arg of %s is block type memory but param is not of block type";
                goto LAB_0011279b;
              }
              uStack_b0 = 0x112638;
              VARR_MIR_var_tget(&local_78,unaff_R13->args,unaff_RBX);
              if ((gen_ctx *)local_78.size != unaff_R12->gen_ctx) goto LAB_001127ab;
            }
            else if (*(char *)&unaff_R12[-1].interp_ctx == '\x11') {
              bVar25 = (int)local_a0 == 0xb5;
              pcVar23 = "RBLK memory can not correspond to unnamed param in %s insn";
              goto LAB_0011279b;
            }
          }
          else {
            uVar16 = (ulong)unaff_R13->nres;
LAB_0011264c:
            unaff_RBX = uVar15 - uVar16;
            if (uVar16 <= uVar15) {
              uStack_b0 = 0x11265f;
              sVar13 = VARR_MIR_var_tlength(unaff_R13->args);
              if (unaff_RBX < sVar13) {
                uStack_b0 = 0x112675;
                VARR_MIR_var_tget(&local_90,unaff_R13->args,unaff_RBX);
                if (0xfffffff9 < local_90.type - MIR_T_UNDEF) {
                  bVar25 = (int)local_a0 == 0xb5;
                  pcVar23 = "param of %s is of block type but arg is not of block type memory";
                  goto LAB_0011279b;
                }
              }
            }
          }
          unaff_R12 = (MIR_context_t)&unaff_R12->temp_string;
        }
        goto LAB_0011251a;
      }
      goto LAB_001127f8;
    }
  }
  if (1 < nops) {
LAB_0011251a:
    uStack_b0 = 0x11252b;
    pMVar14 = create_insn(local_a8,nops,(MIR_insn_code_t)local_a0);
    *(int *)&pMVar14->field_0x1c = (int)nops;
    lVar17 = 0x20;
    while (bVar25 = nops != 0, nops = nops - 1, bVar25) {
      puVar1 = (undefined8 *)((long)ops + lVar17 + -0x20);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      uVar7 = puVar1[2];
      uVar8 = puVar1[3];
      puVar1 = (undefined8 *)((long)ops + lVar17 + -0x10);
      uVar9 = puVar1[1];
      uVar10 = puVar1[2];
      uVar11 = puVar1[3];
      puVar2 = (undefined8 *)((long)pMVar14->ops + lVar17 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      puVar2[2] = uVar10;
      puVar2[3] = uVar11;
      puVar1 = (undefined8 *)((long)pMVar14->ops + lVar17 + -0x20);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      puVar1[2] = uVar7;
      puVar1[3] = uVar8;
      lVar17 = lVar17 + 0x30;
    }
    return pMVar14;
  }
  pcVar23 = "number of MIR_SWITCH operands is less 2";
LAB_00112840:
  puVar19 = &uStack_b0;
  uStack_b0 = 0x15;
  pMVar24 = unaff_R12;
  do {
    uVar5 = *puVar19;
    pcVar3 = *(code **)(puVar19[1] + 0x10);
    *puVar19 = 0x11284c;
    (*pcVar3)(uVar5,pcVar23);
    ppMVar20 = (MIR_context_t *)(puVar19 + 1);
LAB_0011284c:
    pcVar23 = "the 1st unspec operand should be valid unspec code";
    puVar21 = (undefined8 *)((long)ppMVar20 + -8);
    *(undefined8 *)((long)ppMVar20 + -8) = 0x17;
    unaff_R12 = pMVar24;
LAB_00112860:
    uVar5 = *puVar21;
    p_Var4 = unaff_R12->error_func;
    *puVar21 = 0x112868;
    (*p_Var4)((MIR_error_type_t)uVar5,pcVar23);
    ppMVar20 = (MIR_context_t *)(puVar21 + 1);
LAB_00112868:
    pcVar23 = "property should be a integer operand";
    ppMVar22 = ppMVar20;
    pMVar24 = unaff_R12;
LAB_0011286f:
    puVar19 = (undefined8 *)((long)ppMVar22 + -8);
    *(undefined8 *)((long)ppMVar22 + -8) = 0x1a;
  } while( true );
}

Assistant:

MIR_insn_t MIR_new_insn_arr (MIR_context_t ctx, MIR_insn_code_t code, size_t nops, MIR_op_t *ops) {
  MIR_insn_t insn;
  MIR_proto_t proto;
  size_t args_start, narg, i = 0, expected_nops = insn_code_nops (ctx, code);
  mir_assert (nops == 0 || ops != NULL);

  if (!MIR_call_code_p (code) && code != MIR_UNSPEC && code != MIR_USE && code != MIR_PHI
      && code != MIR_RET && code != MIR_SWITCH && nops != expected_nops) {
    MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of operands for insn %s",
                              insn_descs[code].name);
  } else if (code == MIR_SWITCH) {
    if (nops < 2)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_SWITCH operands is less 2");
  } else if (code == MIR_PHI) {
    if (nops < 3)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "number of MIR_PHI operands is less 3");
  } else if (MIR_call_code_p (code) || code == MIR_UNSPEC) {
    args_start = code == MIR_UNSPEC ? 1 : 2;
    if (nops < args_start)
      MIR_get_error_func (ctx) (MIR_ops_num_error, "wrong number of call/unspec operands");
    if (code == MIR_UNSPEC) {
      if (ops[0].mode != MIR_OP_INT || ops[0].u.u >= VARR_LENGTH (MIR_proto_t, unspec_protos))
        MIR_get_error_func (ctx) (MIR_unspec_op_error,
                                  "the 1st unspec operand should be valid unspec code");
      proto = VARR_GET (MIR_proto_t, unspec_protos, ops[0].u.u);
    } else {
      if (ops[0].mode != MIR_OP_REF || ops[0].u.ref->item_type != MIR_proto_item)
        MIR_get_error_func (ctx) (MIR_call_op_error, "the 1st call operand should be a prototype");
      proto = ops[0].u.ref->u.proto;
    }
    i = proto->nres;
    if (proto->args != NULL) i += VARR_LENGTH (MIR_var_t, proto->args);
    if (nops < i + args_start || (nops != i + args_start && !proto->vararg_p))
      MIR_get_error_func (
        ctx) (code == MIR_UNSPEC ? MIR_unspec_op_error : MIR_call_op_error,
              "number of %s operands or results does not correspond to prototype %s",
              code == MIR_UNSPEC ? "unspec" : "call", proto->name);
    for (i = args_start; i < nops; i++) {
      if (ops[i].mode == MIR_OP_MEM && MIR_all_blk_type_p (ops[i].u.mem.type)) {
        if (i - args_start < proto->nres)
          MIR_get_error_func (ctx) (MIR_wrong_type_error, "result of %s is block type memory",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        else if ((narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)) {
          if (VARR_GET (MIR_var_t, proto->args, narg).type != ops[i].u.mem.type) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "arg of %s is block type memory but param is not of block type",
                    code == MIR_UNSPEC ? "unspec" : "call");
          } else if (VARR_GET (MIR_var_t, proto->args, narg).size != (size_t) ops[i].u.mem.disp) {
            MIR_get_error_func (
              ctx) (MIR_wrong_type_error,
                    "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                    (unsigned long) VARR_GET (MIR_var_t, proto->args, narg).size,
                    (unsigned long) ops[i].u.mem.disp, code == MIR_UNSPEC ? "unspec" : "call");
          }
        } else if (ops[i].u.mem.type == MIR_T_RBLK) {
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "RBLK memory can not correspond to unnamed param in %s insn",
                                    code == MIR_UNSPEC ? "unspec" : "call");
        }
      } else if (i - args_start >= proto->nres
                 && (narg = i - args_start - proto->nres) < VARR_LENGTH (MIR_var_t, proto->args)
                 && MIR_all_blk_type_p (VARR_GET (MIR_var_t, proto->args, narg).type)) {
        MIR_get_error_func (
          ctx) (MIR_wrong_type_error,
                "param of %s is of block type but arg is not of block type memory",
                code == MIR_UNSPEC ? "unspec" : "call");
      }
    }
  } else if (code == MIR_VA_ARG) {  // undef mem ???
    if (ops[2].mode != MIR_OP_MEM)
      MIR_get_error_func (ctx) (MIR_op_mode_error,
                                "3rd operand of va_arg should be any memory with given type");
  } else if (code == MIR_PRSET) {
    if (ops[1].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
  } else if (code == MIR_PRBEQ || code == MIR_PRBNE) {
    if (ops[2].mode != MIR_OP_INT)
      MIR_get_error_func (ctx) (MIR_op_mode_error, "property should be a integer operand");
    if (ops[1].mode != MIR_OP_REG && ops[1].mode != MIR_OP_MEM)
      MIR_get_error_func (
        ctx) (MIR_op_mode_error,
              "2nd operand of property branch should be any memory or reg with given type");
  }
  insn = create_insn (ctx, nops, code);
  insn->nops = (unsigned int) nops;
  for (i = 0; i < nops; i++) insn->ops[i] = ops[i];
  return insn;
}